

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::WriteVarint32(CodedOutputStream *this,uint32 value)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  long lStack_8;
  uint8 bytes [5];
  
  if (4 < this->buffer_size_) {
    pbVar1 = this->buffer_;
    *pbVar1 = (byte)value | 0x80;
    if (value < 0x80) {
      *pbVar1 = (byte)value;
      lStack_8 = 1;
    }
    else {
      bVar3 = (byte)(value >> 7);
      pbVar1[1] = bVar3 | 0x80;
      if (value < 0x4000) {
        pbVar1[1] = bVar3;
        lStack_8 = 2;
      }
      else {
        bVar3 = (byte)(value >> 0xe);
        pbVar1[2] = bVar3 | 0x80;
        if (value < 0x200000) {
          pbVar1[2] = bVar3;
          lStack_8 = 3;
        }
        else {
          bVar3 = (byte)(value >> 0x15);
          pbVar1[3] = bVar3 | 0x80;
          if (value < 0x10000000) {
            pbVar1[3] = bVar3;
            lStack_8 = 4;
          }
          else {
            pbVar1[4] = (byte)(value >> 0x1c);
            lStack_8 = 5;
          }
        }
      }
    }
    this->buffer_ = this->buffer_ + lStack_8;
    this->buffer_size_ = this->buffer_size_ - (int)lStack_8;
    return;
  }
  lVar2 = 0;
  for (; 0x7f < value; value = value >> 7) {
    bytes[lVar2] = (byte)value | 0x80;
    lVar2 = lVar2 + 1;
  }
  bytes[lVar2] = (byte)value;
  WriteRaw(this,bytes,(int)lVar2 + 1);
  return;
}

Assistant:

void CodedOutputStream::WriteVarint32(uint32 value) {
  if (buffer_size_ >= kMaxVarint32Bytes) {
    // Fast path:  We have enough bytes left in the buffer to guarantee that
    // this write won't cross the end, so we can skip the checks.
    uint8* target = buffer_;
    uint8* end = WriteVarint32FallbackToArrayInline(value, target);
    int size = end - target;
    Advance(size);
  } else {
    // Slow path:  This write might cross the end of the buffer, so we
    // compose the bytes first then use WriteRaw().
    uint8 bytes[kMaxVarint32Bytes];
    int size = 0;
    while (value > 0x7F) {
      bytes[size++] = (static_cast<uint8>(value) & 0x7F) | 0x80;
      value >>= 7;
    }
    bytes[size++] = static_cast<uint8>(value) & 0x7F;
    WriteRaw(bytes, size);
  }
}